

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O3

void __thiscall
OptionParser::parseOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  string *s;
  int iVar1;
  OptionParser *this_00;
  OptionParser *this_01;
  undefined1 local_d0 [32];
  undefined1 local_b0 [8];
  string keyword;
  string s2;
  string s1;
  string value;
  
  s = (tokenList->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)s)) {
    s2.field_2._8_8_ = &s1._M_string_length;
    s1._M_dataplus._M_p = (pointer)0x0;
    s1._M_string_length._0_1_ = 0;
    keyword.field_2._8_8_ = &s2._M_string_length;
    s2._M_dataplus._M_p = (pointer)0x0;
    s2._M_string_length._0_1_ = 0;
    local_b0 = (undefined1  [8])&keyword._M_string_length;
    keyword._M_dataplus._M_p = (pointer)0x0;
    keyword._M_string_length._0_1_ = 0;
    s1.field_2._8_8_ = &value._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&s1.field_2 + 8),"");
    Utilities::upperCase((string *)local_d0,s);
    std::__cxx11::string::operator=((string *)(s2.field_2._M_local_buf + 8),(string *)local_d0);
    if ((OptionParser *)local_d0._0_8_ != (OptionParser *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_);
    }
    std::__cxx11::string::_M_assign((string *)(keyword.field_2._M_local_buf + 8));
    std::__cxx11::string::_M_assign((string *)(s1.field_2._M_local_buf + 8));
    iVar1 = Utilities::findFullMatch((string *)((long)&s2.field_2 + 8),deprecatedKeywords);
    if (iVar1 < 0) {
      this_00 = (OptionParser *)0x1489fd;
      this_01 = (OptionParser *)(s2.field_2._M_local_buf + 8);
      iVar1 = std::__cxx11::string::compare((char *)this_01);
      if (iVar1 == 0) {
        if ((long)(tokenList->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(tokenList->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start == 0x40) {
          this_01 = (OptionParser *)(s1.field_2._M_local_buf + 8);
          std::__cxx11::string::_M_replace((ulong)this_01,0,value._M_dataplus._M_p,0x14803a);
        }
        parseQualOption(this_01,(string *)((long)&keyword.field_2 + 8),
                        (string *)((long)&s1.field_2 + 8),network);
      }
      else {
        getEpanet3Keyword((string *)local_d0,this_00,(string *)((long)&s2.field_2 + 8),
                          (string *)((long)&keyword.field_2 + 8),(string *)((long)&s1.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_b0,(string *)local_d0);
        if ((OptionParser *)local_d0._0_8_ != (OptionParser *)(local_d0 + 0x10)) {
          operator_delete((void *)local_d0._0_8_);
        }
        if (value._M_dataplus._M_p != (pointer)0x0) {
          setOption((OptionParser *)local_d0._0_8_,(string *)local_b0,
                    (string *)((long)&s1.field_2 + 8),network);
        }
      }
    }
    if ((size_type *)s1.field_2._8_8_ != &value._M_string_length) {
      operator_delete((void *)s1.field_2._8_8_);
    }
    if (local_b0 != (undefined1  [8])&keyword._M_string_length) {
      operator_delete((void *)local_b0);
    }
    if ((size_type *)keyword.field_2._8_8_ != &s2._M_string_length) {
      operator_delete((void *)keyword.field_2._8_8_);
    }
    if ((size_type *)s2.field_2._8_8_ != &s1._M_string_length) {
      operator_delete((void *)s2.field_2._8_8_);
    }
  }
  return;
}

Assistant:

void OptionParser::parseOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens
    if ( tokenList.size() < 2 ) return;
    string* tokens = &tokenList[0];

    // ... parse option keywords
    string s1, s2, keyword;
    string value = "";
    s1 = Utilities::upperCase(tokens[0]);
    s2 = tokens[1];
    if ( tokenList.size() > 2 )
    {
        value = tokens[2];
    }
    else value = s2;

    // ... check for deprecated keywords
    if ( Utilities::findFullMatch(s1, deprecatedKeywords) >= 0 ) return;

    // ... check for EPANET2 "QUALITY" keyword which requires special processing
    if ( s1.compare(w_QUALITY) == 0 )
    {
        if ( tokenList.size() == 2 ) value = "";
        parseQualOption(s2, value, network);
        return;
    }

    // ... get the equivalent EPANET3 keyword
    keyword = getEpanet3Keyword(s1, s2, value);

    // ... set the appropriate option to the parsed value
    if ( !value.empty() ) setOption(keyword, value, network);
}